

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepEdge.h
# Opt level: O1

void anurbs::BrepEdge::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>> *pcVar1;
  string name;
  class_<anurbs::BrepEdge,_std::shared_ptr<anurbs::BrepEdge>_> local_a0;
  long *local_98;
  undefined8 local_90;
  long local_88;
  undefined1 local_80;
  arg local_78;
  code *local_68;
  undefined8 local_60;
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  code *local_38;
  undefined8 local_30;
  code *local_28;
  undefined8 local_20;
  
  local_88 = 0x6567644570657242;
  local_90 = 8;
  local_80 = 0;
  local_98 = &local_88;
  pybind11::class_<anurbs::BrepEdge,_std::shared_ptr<anurbs::BrepEdge>_>::class_<>
            (&local_a0,(m->super_object).super_handle.m_ptr,(char *)&local_88);
  local_28 = faces;
  local_20 = 0;
  pcVar1 = (class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>> *)
           pybind11::class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>>::
           def_property_readonly<std::vector<anurbs::Ref<anurbs::BrepFace>,std::allocator<anurbs::Ref<anurbs::BrepFace>>>(anurbs::BrepEdge::*)()const>
                     ((class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>> *)&local_a0,
                      "faces",(offset_in_Model_to_subr *)&local_28);
  local_38 = loops;
  local_30 = 0;
  pcVar1 = (class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>> *)
           pybind11::class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>>::
           def_property_readonly<std::vector<anurbs::Ref<anurbs::BrepLoop>,std::allocator<anurbs::Ref<anurbs::BrepLoop>>>(anurbs::BrepEdge::*)()const>
                     (pcVar1,"loops",(offset_in_Model_to_subr *)&local_38);
  local_48 = nb_trims;
  local_40 = 0;
  pcVar1 = (class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>> *)
           pybind11::class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>>::
           def_property_readonly<unsigned_long(anurbs::BrepEdge::*)()const>
                     (pcVar1,"nb_trims",(offset_in_Model_to_subr *)&local_48);
  local_58 = trims;
  local_50 = 0;
  pcVar1 = (class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>> *)
           pybind11::class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>>::
           def_property_readonly<std::vector<anurbs::Ref<anurbs::BrepTrim>,std::allocator<anurbs::Ref<anurbs::BrepTrim>>>(anurbs::BrepEdge::*)()const>
                     (pcVar1,"trims",(offset_in_Model_to_subr *)&local_58);
  local_68 = trim;
  local_60 = 0;
  local_78.name = "index";
  local_78._8_1_ = 2;
  pybind11::class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>>::
  def<anurbs::Ref<anurbs::BrepTrim>(anurbs::BrepEdge::*)(unsigned_long)const,pybind11::arg>
            (pcVar1,"trim",(offset_in_Model_to_subr *)&local_68,&local_78);
  pybind11::object::~object((object *)&local_a0);
  Model::register_python_data_type<anurbs::BrepEdge>(m,model);
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = BrepEdge;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Holder>(m, name.c_str())
            // read-only properties
            .def_property_readonly("faces", &Type::faces)
            .def_property_readonly("loops", &Type::loops)
            .def_property_readonly("nb_trims", &Type::nb_trims)
            .def_property_readonly("trims", &Type::trims)
            // methods
            .def("trim", &Type::trim, "index"_a)
        ;

        Model::register_python_data_type<Type>(m, model);
    }